

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::MILSpec::Argument_Binding::ByteSizeLong(Argument_Binding *this)

{
  bool bVar1;
  BindingCase BVar2;
  int size;
  string *value;
  long lVar3;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  Argument_Binding *this_local;
  
  _cached_size = 0;
  BVar2 = binding_case(this);
  if (BVar2 != BINDING_NOT_SET) {
    if (BVar2 == kName) {
      value = _internal_name_abi_cxx11_(this);
      _cached_size = google::protobuf::internal::WireFormatLite::StringSize(value);
      _cached_size = _cached_size + 1;
    }
    else if (BVar2 == kValue) {
      _cached_size = google::protobuf::internal::WireFormatLite::
                     MessageSize<CoreML::Specification::MILSpec::Value>((this->binding_).value_);
      _cached_size = _cached_size + 1;
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    _cached_size = lVar3 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t Argument_Binding::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Argument.Binding)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (binding_case()) {
    // string name = 1;
    case kName: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
      break;
    }
    // .CoreML.Specification.MILSpec.Value value = 2;
    case kValue: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *binding_.value_);
      break;
    }
    case BINDING_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}